

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O2

int __thiscall
SatPos::CalculateSatVel
          (SatPos *this,long *Eph,int flag,undefined8 param_4,undefined8 param_5,undefined8 param_6)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  SatPos *pSVar5;
  double *pdVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  XYZ *pXVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined8 local_1440 [600];
  double local_180;
  undefined1 local_172;
  byte local_171;
  double local_170;
  XYZ *local_168;
  double local_160;
  double local_158;
  double local_140;
  double local_138;
  undefined4 local_12c;
  double local_128;
  double local_120;
  double local_118;
  int local_10c;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  Vector3d velocity;
  Matrix<double,_4,_1> local_50;
  Matrix<double,_3,_4> local_40;
  
  bVar12 = 0;
  local_172 = flag != 0;
  if (flag == 0) {
    lVar2 = 0x20;
    local_e8 = 7.2921151467e-05;
    pSVar5 = this;
  }
  else {
    if (flag != 4) {
      return -2;
    }
    lVar2 = 0x40;
    local_e8 = 7.292115e-05;
    pSVar5 = (SatPos *)this->Bds;
  }
  pdVar6 = &pSVar5->Gps[0].n;
  pXVar9 = &this->Bds[0].GK;
  lVar11 = 0;
  uVar10 = 0;
  local_10c = flag;
  do {
    if (lVar2 * 0xd8 == lVar11) {
      return 0;
    }
    local_118 = *pdVar6;
    if ((local_118 != -1.0) || (NAN(local_118))) {
      local_170 = *(double *)(*Eph + 0x30 + lVar11);
      local_180 = pdVar6[-8];
      dVar13 = cos(pdVar6[-7]);
      local_118 = local_118 / (1.0 - dVar13 * local_170);
      if (local_10c == 0) {
        pdVar3 = &pXVar9[-0xf0].X;
LAB_00109658:
        *pdVar3 = local_118;
        local_12c = (undefined4)CONCAT71((int7)((ulong)pdVar3 >> 8),local_172);
      }
      else {
        if (local_10c == 4) {
          pdVar3 = &this->Bds[uVar10].Ekdot;
          goto LAB_00109658;
        }
        local_12c = 0;
      }
      dVar13 = *(double *)(*Eph + 0x30 + lVar11);
      dVar13 = (dVar13 + 1.0) / (1.0 - dVar13);
      if (dVar13 < 0.0) {
        local_120 = sqrt(dVar13);
      }
      else {
        local_120 = SQRT(dVar13);
      }
      local_170 = cos(pdVar6[-9] * 0.5);
      dVar13 = cos(pdVar6[-7] * 0.5);
      local_120 = local_120 * (local_170 / dVar13) * (local_170 / dVar13) * local_118;
      local_128 = *(double *)(*Eph + 0x50 + lVar11);
      local_180 = local_180 + local_180;
      local_170 = cos(local_180);
      local_160 = *(double *)(*Eph + 0x48 + lVar11);
      local_138 = sin(local_180);
      dVar13 = *(double *)(*Eph + 0x38 + lVar11);
      dVar1 = *(double *)(*Eph + 0x30 + lVar11);
      dVar14 = sin(pdVar6[-7]);
      local_f8 = *(double *)(*Eph + 0x60 + lVar11);
      dVar15 = cos(local_180);
      dVar23 = *(double *)(*Eph + 0x58 + lVar11);
      dVar16 = sin(local_180);
      local_168 = *(XYZ **)(*Eph + 0x70 + lVar11);
      local_f0 = cos(local_180);
      local_158 = *(double *)(*Eph + 0x68 + lVar11);
      dVar17 = sin(local_180);
      dVar17 = local_f0 * (double)local_168 - dVar17 * local_158;
      local_f0 = (dVar17 + dVar17) * local_120 + *(double *)(*Eph + 0x80 + lVar11);
      local_e0 = *(double *)(*Eph + 0x90 + lVar11);
      local_171 = (int)uVar10 - 0x3aU < 0xffffffcb & (byte)local_12c;
      if (local_171 == 0) {
        local_e0 = local_e0 - local_e8;
      }
      dVar17 = local_128 * local_170 - local_138 * local_160;
      local_128 = (dVar17 + dVar17) * local_120 + local_120;
      local_138 = pdVar6[-4];
      local_168 = pXVar9;
      local_140 = cos(pdVar6[-5]);
      local_160 = pdVar6[-4];
      local_100 = sin(pdVar6[-5]);
      dVar17 = cos(pdVar6[-5]);
      dVar22 = pdVar6[-4] * local_128;
      dVar18 = sin(pdVar6[-5]);
      dVar19 = sin(pdVar6[-5]);
      local_128 = local_128 * pdVar6[-4];
      dVar20 = cos(pdVar6[-5]);
      local_170 = pdVar6[-3];
      local_180 = pdVar6[-2];
      local_40.rows = 3;
      local_40.cols = 4;
      local_40.data = (double *)operator_new__(0x60);
      local_158 = cos(local_180);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,0,0);
      *pdVar3 = local_158;
      local_158 = sin(local_180);
      local_108 = cos(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,0,1);
      *pdVar3 = local_108 * -local_158;
      local_158 = sin(local_180);
      local_108 = cos(local_180);
      dVar21 = cos(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,0,2);
      local_138 = local_138 * local_140;
      local_160 = local_160 * local_100;
      *pdVar3 = -(local_158 * local_138 + local_108 * local_160 * dVar21);
      local_158 = sin(local_180);
      local_140 = sin(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,0,3);
      *pdVar3 = local_158 * local_160 * local_140;
      local_158 = sin(local_180);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,1,0);
      *pdVar3 = local_158;
      local_158 = cos(local_180);
      local_140 = cos(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,1,1);
      *pdVar3 = local_158 * local_140;
      local_158 = cos(local_180);
      local_140 = sin(local_180);
      local_100 = cos(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,1,2);
      *pdVar3 = local_138 * local_158 - local_140 * local_160 * local_100;
      local_180 = cos(local_180);
      local_138 = sin(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,1,3);
      *pdVar3 = local_180 * local_160 * local_138;
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,2,0);
      *pdVar3 = 0.0;
      local_180 = sin(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,2,1);
      *pdVar3 = local_180;
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,2,2);
      *pdVar3 = 0.0;
      local_180 = cos(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_40,2,3);
      *pdVar3 = local_160 * local_180;
      local_50.rows = 4;
      local_50.cols = 1;
      local_50.data = (double *)operator_new__(0x20);
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_50,0,0);
      dVar23 = local_f8 * dVar15 - dVar16 * dVar23;
      local_f8 = (dVar23 + dVar23) * local_120 + local_118 * dVar13 * dVar13 * dVar1 * dVar14;
      *pdVar3 = dVar17 * local_f8 - dVar22 * dVar18;
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_50,1,0);
      *pdVar3 = local_f8 * dVar19 + local_128 * dVar20;
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_50,2,0);
      *pdVar3 = local_e0;
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_50,3,0);
      *pdVar3 = local_f0;
      velocity = Matrix<double,3,4>::operator*((Matrix<double,3,4> *)&local_40,&local_50);
      if (local_10c == 0) {
        pdVar3 = Matrix<double,_3,_1>::operator()(&velocity,0,0);
        *(double *)((long)(local_168 + -0xf7) + 0x10) = *pdVar3;
        pdVar3 = Matrix<double,_3,_1>::operator()(&velocity,1,0);
        local_168[-0xf6].X = *pdVar3;
        pdVar3 = Matrix<double,_3,_1>::operator()(&velocity,2,0);
        *(double *)((long)(local_168 + -0xf6) + 8) = *pdVar3;
      }
      if (local_171 == 0) {
        if ((char)local_12c == '\x01' && (int)uVar10 - 5U < 0x35) {
          pdVar3 = Matrix<double,_3,_1>::operator()(&velocity,0,0);
          local_168[-1].X = *pdVar3;
          pdVar3 = Matrix<double,_3,_1>::operator()(&velocity,1,0);
          local_168[-1].Y = *pdVar3;
          pdVar3 = Matrix<double,_3,_1>::operator()(&velocity,2,0);
          local_168[-1].Z = *pdVar3;
        }
      }
      else {
        pSVar5 = (SatPos *)pdVar6[-6];
        puVar7 = (undefined8 *)&stack0x00000008;
        puVar8 = local_1440;
        for (lVar4 = 599; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar8 = *puVar7;
          puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
          puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
        }
        CalculateGEOVel(pSVar5,this,uVar10 & 0xffffffff,velocity._0_8_,velocity.data,param_5,param_6
                        ,local_168->X,local_168->Y,local_168->Z);
      }
      Matrix<double,_3,_1>::deleteMatrix(&velocity);
      Matrix<double,_4,_1>::deleteMatrix(&local_50);
      Matrix<double,_3,_4>::deleteMatrix(&local_40);
      pXVar9 = local_168;
    }
    uVar10 = uVar10 + 1;
    lVar11 = lVar11 + 0xd8;
    pdVar6 = pdVar6 + 0x17;
    pXVar9 = (XYZ *)((long)(pXVar9 + 7) + 0x10);
  } while( true );
}

Assistant:

int SatPos::CalculateSatVel(Ephemeris* &&Eph, const NavSys flag, SPPResult result)
{
    int maxprn;
    double RotationRate;
    Satellite* param;

    if(flag == GPS)
    {
        maxprn = MAXGPSSRN;
        RotationRate = GPSROTATIONRATE;
        param = this->Gps;
    }
    else if(flag == BDS)
    {
        maxprn = MAXBDSSRN;
        RotationRate = BDSROTATIONRATE;
        param = this->Bds;
    }
    else
        return UNSUPPORTED_MSG;

    for(int prn = 0; prn < maxprn; ++prn)
    {
        if(param[prn].n == -1)
            continue;

        try
        {   
            // temp
            double phik = param[prn].phik;
            double Ekdot = param[prn].n / (1 - Eph[prn].ecc * cos(param[prn].Ek));
            if(flag == GPS)
                this->Gps[prn].Ekdot = Ekdot;
            if(flag == BDS)
                this->Bds[prn].Ekdot = Ekdot;

            // temp param, to calculate long equation
            double left = sqrt((1 + Eph[prn].ecc) / (1 - Eph[prn].ecc));
            double right = cos(param[prn].vk / 2.0) / cos(param[prn].Ek / 2.0);
            double Phikdot = left * right * right * Ekdot;

            left = Eph[prn].cus * cos(2 * phik) - Eph[prn].cuc * sin(2 * phik);
            double ukdot = 2 * left * Phikdot + Phikdot;

            left = Eph[prn].sqrtA * Eph[prn].sqrtA * Eph[prn].ecc * sin(param[prn].Ek) * Ekdot;
            right = 2 * (Eph[prn].crs * cos(2 * phik) - Eph[prn].crc * sin(2 * phik));
            double rkdot = left + right * Phikdot;

            right = 2 * (Eph[prn].cis * cos(2 * phik) - Eph[prn].cic * sin(2 * phik));
            double Ikdot = Eph[prn].I0Rate + right * Phikdot;

            double Omegakdot = Eph[prn].omegaORate - RotationRate;

            if(flag == BDS && (prn < 5 || prn >= 58))
                Omegakdot = Eph[prn].omegaORate;
            
            double XK = param[prn].rk * cos(param[prn].uk);
            double YK = param[prn].rk * sin(param[prn].uk);
            double XKdot = rkdot * cos(param[prn].uk) - param[prn].rk * ukdot * sin(param[prn].uk);
            double YKdot = rkdot * sin(param[prn].uk) + param[prn].rk * ukdot * cos(param[prn].uk);

            // temp
            double Omegak = param[prn].Omegak;
            double ik = param[prn].ik;

            Matrix<double, 3, 4> Rdot;
            Rdot(0, 0) = cos(Omegak);
            Rdot(0, 1) = -sin(Omegak) * cos(ik);
            Rdot(0, 2) = -(XK * sin(Omegak) + YK * cos(Omegak) * cos(ik));
            Rdot(0, 3) = YK * sin(Omegak) * sin(ik);

            Rdot(1, 0) = sin(Omegak);
            Rdot(1, 1) = cos(Omegak) * cos(ik);
            Rdot(1, 2) = XK * cos(Omegak) - YK * sin(Omegak) * cos(ik);
            Rdot(1, 3) = YK * cos(Omegak) * sin(ik);

            Rdot(2, 0) = 0;
            Rdot(2, 1) = sin(ik);
            Rdot(2, 2) = 0;
            Rdot(2, 3) = YK * cos(ik);
            
            Matrix<double, 4, 1> p;
            p(0, 0) = XKdot;
            p(1, 0) = YKdot;
            p(2, 0) = Omegakdot;
            p(3, 0) = Ikdot;

            Vector3d velocity = Rdot * p;
            if(flag == GPS)
            {
                // 有些累赘  其实可以不用XYZ来存储
                // 可以全部存储为Matrix数据
                Gps[prn].SatVelocity.X = velocity(0, 0);
                Gps[prn].SatVelocity.Y = velocity(1, 0);
                Gps[prn].SatVelocity.Z = velocity(2, 0);
            }
            if(flag == BDS && (prn <5 || prn >= 58))
            {
                CalculateGEOVel(param[prn].tk, Bds[prn].GK, prn, velocity, result);
            }
            if(flag == BDS && (prn >= 5 && prn < 58))
            {
                Bds[prn].SatVelocity.X = velocity(0, 0);
                Bds[prn].SatVelocity.Y = velocity(1, 0);
                Bds[prn].SatVelocity.Z = velocity(2, 0);
            }
            // cout << Bds[prn].SatPosition << endl;

            velocity.deleteMatrix();
            p.deleteMatrix();
            Rdot.deleteMatrix();
        }
        catch(...)
        {
            cout << "error happened when calculate satellite velocity" << endl;
            return UNKNOWN_ERROR;
        }
        
    }
    return 0;
}